

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O0

filepos_t EBML_ReadCodedSizeSignedValue(uint8_t *InBuffer,size_t *BufferSize,filepos_t *SizeUnknown)

{
  filepos_t local_28;
  filepos_t Result;
  filepos_t *SizeUnknown_local;
  size_t *BufferSize_local;
  uint8_t *InBuffer_local;
  
  local_28 = EBML_ReadCodedSizeValue(InBuffer,BufferSize,SizeUnknown);
  if (*BufferSize != 0) {
    switch(*BufferSize) {
    case 1:
      local_28 = local_28 + -0x3f;
      break;
    case 2:
      local_28 = local_28 + -0x1fff;
      break;
    case 3:
      local_28 = local_28 + -0xfffff;
      break;
    case 4:
      local_28 = local_28 + -0x7ffffff;
    }
  }
  return local_28;
}

Assistant:

filepos_t EBML_ReadCodedSizeSignedValue(const uint8_t *InBuffer, size_t *BufferSize, filepos_t *SizeUnknown)
{
    filepos_t Result = EBML_ReadCodedSizeValue(InBuffer, BufferSize, SizeUnknown);

    if (*BufferSize != 0)
    {
        switch (*BufferSize)
        {
        case 1:
            Result -= 63;
            break;
        case 2:
            Result -= 8191;
            break;
        case 3:
            Result -= 1048575L;
            break;
        case 4:
            Result -= 134217727L;
            break;
        }
    }

    return Result;
}